

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wu_2009.h
# Opt level: O2

void __thiscall SAUF<TTA>::FirstScan(SAUF<TTA> *this)

{
  uint uVar1;
  Mat1b *pMVar2;
  Mat1i *pMVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar5 = *(uint *)&pMVar2->field_0x8;
  uVar1 = *(uint *)&pMVar2->field_0xc;
  memset(*(void **)&pMVar3->field_0x10,0,*(long *)&pMVar3->field_0x20 - *(long *)&pMVar3->field_0x18
        );
  uVar10 = 0;
  *TTA::rtable_ = 0;
  uVar12 = 0;
  if (0 < (int)uVar1) {
    uVar12 = (ulong)uVar1;
  }
  uVar13 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar13 = uVar10;
  }
  TTA::length_ = 1;
  lVar11 = -1;
  do {
    if (uVar10 == uVar13) {
      return;
    }
    pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar4 = *(long *)&pMVar2->field_0x10;
    lVar15 = **(long **)&pMVar2->field_0x48;
    lVar14 = lVar15 * uVar10 + lVar4;
    lVar7 = *(long *)&pMVar3->field_0x10;
    lVar9 = **(long **)&pMVar3->field_0x48;
    lVar8 = lVar9 * uVar10 + lVar7;
    lVar7 = lVar9 * lVar11 + lVar7;
    lVar4 = lVar4 + lVar15 * lVar11;
    lVar9 = 0;
    lVar15 = -1;
    while (lVar15 - uVar12 != -1) {
      if (*(char *)(lVar14 + 1 + lVar15) != '\0') {
        if (uVar10 == 0) {
          lVar6 = lVar15;
          if (lVar15 != -1) {
LAB_001b5a91:
            if (*(char *)(lVar14 + lVar6) != '\0') {
              uVar5 = *(uint *)(lVar8 + lVar6 * 4);
              goto LAB_001b5b08;
            }
          }
LAB_001b5ae7:
          uVar5 = TTA::NewLabel();
        }
        else if (*(char *)(lVar4 + 1 + lVar15) == '\0') {
          if ((lVar15 + 1 < (long)(int)uVar1 + -1) && (*(char *)(lVar4 + 2 + lVar15) != '\0')) {
            if (lVar15 == -1) {
LAB_001b5b50:
              uVar5 = *(uint *)(lVar7 + 8 + lVar15 * 4);
            }
            else {
              if (*(char *)(lVar4 + lVar15) == '\0') {
                if (*(char *)(lVar14 + lVar15) == '\0') goto LAB_001b5b50;
                uVar5 = *(uint *)(lVar8 + lVar15 * 4);
              }
              else {
                uVar5 = *(uint *)(lVar7 + lVar15 * 4);
              }
              uVar5 = TTA::Merge(uVar5,*(uint *)(lVar7 + 8 + lVar15 * 4));
            }
          }
          else {
            if (lVar15 == -1) goto LAB_001b5ae7;
            if (*(char *)(lVar4 + lVar15) == '\0') {
              lVar6 = lVar9 + -1;
              goto LAB_001b5a91;
            }
            uVar5 = *(uint *)(lVar7 + lVar15 * 4);
          }
        }
        else {
          uVar5 = *(uint *)(lVar7 + 4 + lVar15 * 4);
        }
LAB_001b5b08:
        *(uint *)(lVar8 + 4 + lVar15 * 4) = uVar5;
      }
      lVar9 = lVar9 + 1;
      lVar15 = lVar15 + 1;
    }
    uVar10 = uVar10 + 1;
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

void FirstScan() {

        const int h = img_.rows;
        const int w = img_.cols;

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization

        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const * const img_row = img_.ptr<unsigned char>(r);
            unsigned char const * const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned * const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned * const  img_labels_row_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img_row_prev[c - 1] > 0
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_R c < w - 1 && r > 0 && img_row_prev[c + 1] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#include "labeling_wu_2009_tree.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }